

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

token * src_extract_token(Source_File *src,KEYWORDS kw)

{
  token *word;
  
  word = (token *)malloc(0x30);
  word->type = kw;
  word->data_size = src->best_token_size;
  word->column = src->best_token_column;
  word->line = src->best_token_line;
  word->data = src->src + src->best_token_where_in_src_start;
  word->filename = src->src_name->filename;
  handle_splicing(word);
  src->where_in_src = src->best_token_where_in_src_end;
  src->is_in_the_begining_of_line = src->best_token_beg_line;
  return word;
}

Assistant:

struct token* src_extract_token(struct Source_File *src,enum KEYWORDS kw)
{
	struct token *ret;
	ret=malloc(sizeof(struct token));
	ret->type=kw;

	ret->data_size=src->best_token_size;
	ret->column=src->best_token_column;
	ret->line=src->best_token_line;
	ret->data=src->src+src->best_token_where_in_src_start;
	ret->filename=src->src_name->filename;
	handle_splicing(ret);
	src->where_in_src=src->best_token_where_in_src_end;
	src->is_in_the_begining_of_line=src->best_token_beg_line;
	return ret;
}